

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O0

void aom_highbd_dc_predictor_16x8_sse2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint16_t *in_RCX;
  long in_RSI;
  undefined8 *in_RDI;
  ushort extraout_XMM0_Wa;
  ushort extraout_XMM0_Wa_00;
  int i;
  __m128i row;
  uint32_t sum32;
  __m128i sum;
  __m128i zero;
  __m128i sum_above;
  __m128i sum_left;
  int local_25c;
  uint16_t *in_stack_fffffffffffffdb8;
  undefined2 local_23c;
  uint local_218;
  uint local_208;
  undefined8 *local_1d0;
  
  dc_sum_8(in_RCX);
  dc_sum_16(in_stack_fffffffffffffdb8);
  local_208 = (uint)extraout_XMM0_Wa;
  local_218 = (uint)extraout_XMM0_Wa_00;
  local_23c = (undefined2)((local_208 + local_218 + 0xc) / 0x18);
  uVar1 = CONCAT26(local_23c,CONCAT24(local_23c,CONCAT22(local_23c,local_23c)));
  uVar2 = CONCAT26(local_23c,CONCAT24(local_23c,CONCAT22(local_23c,local_23c)));
  local_1d0 = in_RDI;
  for (local_25c = 0; local_25c < 2; local_25c = local_25c + 1) {
    *local_1d0 = uVar1;
    local_1d0[1] = uVar2;
    local_1d0[2] = uVar1;
    local_1d0[3] = uVar2;
    local_1d0 = (undefined8 *)(in_RSI * 2 + (long)local_1d0);
    *local_1d0 = uVar1;
    local_1d0[1] = uVar2;
    local_1d0[2] = uVar1;
    local_1d0[3] = uVar2;
    local_1d0 = (undefined8 *)(in_RSI * 2 + (long)local_1d0);
    *local_1d0 = uVar1;
    local_1d0[1] = uVar2;
    local_1d0[2] = uVar1;
    local_1d0[3] = uVar2;
    local_1d0 = (undefined8 *)(in_RSI * 2 + (long)local_1d0);
    *local_1d0 = uVar1;
    local_1d0[1] = uVar2;
    local_1d0[2] = uVar1;
    local_1d0[3] = uVar2;
    local_1d0 = (undefined8 *)(in_RSI * 2 + (long)local_1d0);
  }
  return;
}

Assistant:

void aom_highbd_dc_predictor_16x8_sse2(uint16_t *dst, ptrdiff_t stride,
                                       const uint16_t *above,
                                       const uint16_t *left, int bd) {
  (void)bd;
  __m128i sum_left = dc_sum_8(left);
  __m128i sum_above = dc_sum_16(above);
  const __m128i zero = _mm_setzero_si128();
  sum_left = _mm_unpacklo_epi16(sum_left, zero);
  sum_above = _mm_unpacklo_epi16(sum_above, zero);
  const __m128i sum = _mm_add_epi32(sum_left, sum_above);
  uint32_t sum32 = (uint32_t)_mm_cvtsi128_si32(sum);
  sum32 += 12;
  sum32 /= 24;
  const __m128i row = _mm_set1_epi16((int16_t)sum32);
  int i;
  for (i = 0; i < 2; ++i) {
    _mm_store_si128((__m128i *)dst, row);
    _mm_store_si128((__m128i *)(dst + 8), row);
    dst += stride;
    _mm_store_si128((__m128i *)dst, row);
    _mm_store_si128((__m128i *)(dst + 8), row);
    dst += stride;
    _mm_store_si128((__m128i *)dst, row);
    _mm_store_si128((__m128i *)(dst + 8), row);
    dst += stride;
    _mm_store_si128((__m128i *)dst, row);
    _mm_store_si128((__m128i *)(dst + 8), row);
    dst += stride;
  }
}